

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRpo.c
# Opt level: O0

void Abc_TruthRpoTest(char *pFileName,int nVarNum,int nThreshold,int fVerbose)

{
  Rpo_TtStore_t *p_00;
  Rpo_TtStore_t *p;
  int fVerbose_local;
  int nThreshold_local;
  int nVarNum_local;
  char *pFileName_local;
  
  p_00 = Abc_TtStoreLoad(pFileName,nVarNum);
  if (fVerbose != 0) {
    Abc_Print(-2,"Number of variables = %d\n",(ulong)(uint)p_00->nVars);
  }
  Abc_TruthRpoPerform(p_00,nThreshold,fVerbose);
  Abc_TtStoreFree(p_00,nVarNum);
  return;
}

Assistant:

void Abc_TruthRpoTest(char * pFileName, int nVarNum, int nThreshold, int fVerbose) {
    Rpo_TtStore_t * p;

    // allocate data-structure
//    if (fVerbose) {
//        Abc_Print(-2, "Number of variables = %d\n", nVarNum);
//    }
    p = Abc_TtStoreLoad(pFileName, nVarNum);

    if (fVerbose) {
        Abc_Print(-2, "Number of variables = %d\n", p->nVars);
    }
    // consider functions from the file
    Abc_TruthRpoPerform(p, nThreshold, fVerbose);

    // delete data-structure
    Abc_TtStoreFree(p, nVarNum);
    //    printf( "Finished decomposing truth tables from file \"%s\".\n", pFileName );
}